

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O3

int __thiscall
CNetBan::Ban<CNetBan::CBanPool<CNetRange,16>>
          (CNetBan *this,CBanPool<CNetRange,_16> *pBanPool,CDataType *pData,int Seconds,
          char *pReason)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  CBan<CNetRange> *pBan;
  _func_int **pp_Var4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  IConsole *pIVar8;
  int Type;
  int iVar9;
  long in_FS_OFFSET;
  char aBuf [128];
  CNetHash local_100;
  char local_f8 [128];
  CBanInfo local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsBannable<CNetRange>(this,pData);
  if (bVar2) {
    local_78.m_LastInfoQuery = time_timestamp();
    local_78.m_Expires = -1;
    if (0 < Seconds) {
      local_78.m_Expires = local_78.m_LastInfoQuery + Seconds;
    }
    local_78.m_aReason[0x30] = '\0';
    local_78.m_aReason[0x31] = '\0';
    local_78.m_aReason[0x32] = '\0';
    local_78.m_aReason[0x33] = '\0';
    local_78.m_aReason[0x34] = '\0';
    local_78.m_aReason[0x35] = '\0';
    local_78.m_aReason[0x36] = '\0';
    local_78.m_aReason[0x37] = '\0';
    local_78.m_aReason[0x38] = '\0';
    local_78.m_aReason[0x39] = '\0';
    local_78.m_aReason[0x3a] = '\0';
    local_78.m_aReason[0x3b] = '\0';
    local_78.m_aReason[0x3c] = '\0';
    local_78.m_aReason[0x3d] = '\0';
    local_78.m_aReason[0x3e] = '\0';
    local_78.m_aReason[0x3f] = '\0';
    local_78.m_aReason[0x20] = '\0';
    local_78.m_aReason[0x21] = '\0';
    local_78.m_aReason[0x22] = '\0';
    local_78.m_aReason[0x23] = '\0';
    local_78.m_aReason[0x24] = '\0';
    local_78.m_aReason[0x25] = '\0';
    local_78.m_aReason[0x26] = '\0';
    local_78.m_aReason[0x27] = '\0';
    local_78.m_aReason[0x28] = '\0';
    local_78.m_aReason[0x29] = '\0';
    local_78.m_aReason[0x2a] = '\0';
    local_78.m_aReason[0x2b] = '\0';
    local_78.m_aReason[0x2c] = '\0';
    local_78.m_aReason[0x2d] = '\0';
    local_78.m_aReason[0x2e] = '\0';
    local_78.m_aReason[0x2f] = '\0';
    local_78.m_aReason[0x10] = '\0';
    local_78.m_aReason[0x11] = '\0';
    local_78.m_aReason[0x12] = '\0';
    local_78.m_aReason[0x13] = '\0';
    local_78.m_aReason[0x14] = '\0';
    local_78.m_aReason[0x15] = '\0';
    local_78.m_aReason[0x16] = '\0';
    local_78.m_aReason[0x17] = '\0';
    local_78.m_aReason[0x18] = '\0';
    local_78.m_aReason[0x19] = '\0';
    local_78.m_aReason[0x1a] = '\0';
    local_78.m_aReason[0x1b] = '\0';
    local_78.m_aReason[0x1c] = '\0';
    local_78.m_aReason[0x1d] = '\0';
    local_78.m_aReason[0x1e] = '\0';
    local_78.m_aReason[0x1f] = '\0';
    local_78.m_aReason[0] = '\0';
    local_78.m_aReason[1] = '\0';
    local_78.m_aReason[2] = '\0';
    local_78.m_aReason[3] = '\0';
    local_78.m_aReason[4] = '\0';
    local_78.m_aReason[5] = '\0';
    local_78.m_aReason[6] = '\0';
    local_78.m_aReason[7] = '\0';
    local_78.m_aReason[8] = '\0';
    local_78.m_aReason[9] = '\0';
    local_78.m_aReason[10] = '\0';
    local_78.m_aReason[0xb] = '\0';
    local_78.m_aReason[0xc] = '\0';
    local_78.m_aReason[0xd] = '\0';
    local_78.m_aReason[0xe] = '\0';
    local_78.m_aReason[0xf] = '\0';
    str_copy(local_78.m_aReason,pReason,0x40);
    local_100.m_HashIndex = 0;
    bVar3 = (pData->m_LB).ip[0];
    local_100.m_Hash = 0;
    if (bVar3 == (pData->m_UB).ip[0]) {
      local_100.m_Hash = 0;
      lVar6 = 0;
      do {
        local_100.m_Hash = local_100.m_Hash + (uint)bVar3;
        bVar3 = (pData->m_LB).ip[lVar6 + 1];
        lVar7 = lVar6 + 1;
        lVar1 = lVar6 + 1;
        lVar6 = lVar7;
      } while (bVar3 == (pData->m_UB).ip[lVar1]);
      local_100.m_HashIndex = (int)lVar7;
      local_100.m_Hash = local_100.m_Hash & 0xff;
    }
    pBan = CBanPool<CNetRange,_16>::Find(pBanPool,pData,&local_100);
    if (pBan == (CBan<CNetRange> *)0x0) {
      pBan = CBanPool<CNetRange,_16>::Add(pBanPool,pData,&local_78,&local_100);
      if (pBan == (CBan<CNetRange> *)0x0) {
        pIVar8 = this->m_pConsole;
        pp_Var4 = (pIVar8->super_IInterface)._vptr_IInterface;
        pcVar5 = "ban failed (full banlist)";
        goto LAB_00137da2;
      }
      iVar9 = 0;
      Type = 2;
    }
    else {
      CBanPool<CNetRange,_16>::Update(pBanPool,pBan,&local_78);
      iVar9 = 1;
      Type = 1;
    }
    MakeBanInfo<CNetRange>(this,pBan,local_f8,0x80,Type,(int *)0x0);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"net_ban",local_f8,0);
  }
  else {
    pIVar8 = this->m_pConsole;
    pp_Var4 = (pIVar8->super_IInterface)._vptr_IInterface;
    pcVar5 = "ban failed (localhost)";
LAB_00137da2:
    (*pp_Var4[0x19])(pIVar8,0,"net_ban",pcVar5,0);
    iVar9 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

int CNetBan::Ban(T *pBanPool, const typename T::CDataType *pData, int Seconds, const char *pReason)
{
	// do not ban localhost
	if(!IsBannable(pData))
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "ban failed (localhost)");
		return -1;
	}

	int Time = time_timestamp();
	int Stamp = Seconds > 0 ? Time+Seconds : CBanInfo::EXPIRES_NEVER;

	// set up info
	CBanInfo Info = {0};
	Info.m_Expires = Stamp;
	Info.m_LastInfoQuery = Time;
	str_copy(Info.m_aReason, pReason, sizeof(Info.m_aReason));

	// check if it already exists
	CNetHash NetHash(pData);
	CBan<typename T::CDataType> *pBan = pBanPool->Find(pData, &NetHash);
	if(pBan)
	{
		// adjust the ban
		pBanPool->Update(pBan, &Info);
		char aBuf[128];
		MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_LIST);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		return 1;
	}

	// add ban and print result
	pBan = pBanPool->Add(pData, &Info, &NetHash);
	if(pBan)
	{
		char aBuf[128];
		MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_BANADD);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		return 0;
	}
	else
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "ban failed (full banlist)");
	return -1;
}